

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

void fy_parse_input_reset(fy_parser *fyp)

{
  fy_input *pfVar1;
  fy_input *fyi;
  
  fyi = (fy_input *)(fyp->queued_inputs)._lh.next;
  if (fyi != (fy_input *)0x0 && fyi != (fy_input *)&fyp->queued_inputs) {
    do {
      pfVar1 = (fy_input *)(fyi->node).next;
      fy_input_unref(fyi);
      if (pfVar1 == (fy_input *)&fyp->queued_inputs) break;
      fyi = pfVar1;
    } while (pfVar1 != (fy_input *)0x0);
  }
  fy_parse_parse_state_log_list_recycle_all(fyp,&fyp->state_stack);
  fyp->field_0x70 = fyp->field_0x70 & 0xf9;
  fyp->state = FYPS_NONE;
  fyp->pending_complex_key_column = -1;
  fyp->last_block_mapping_key_line = -1;
  return;
}

Assistant:

static void fy_parse_input_reset(struct fy_parser *fyp) {
    struct fy_input *fyi, *fyin;

    for (fyi = fy_input_list_head(&fyp->queued_inputs); fyi; fyi = fyin) {
        fyin = fy_input_next(&fyp->queued_inputs, fyi);
        fy_input_unref(fyi);
    }

    fy_parse_parse_state_log_list_recycle_all(fyp, &fyp->state_stack);

    fyp->stream_end_produced = false;
    fyp->stream_start_produced = false;
    fyp->state = FYPS_NONE;

    fyp->pending_complex_key_column = -1;
    fyp->last_block_mapping_key_line = -1;
}